

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.hpp
# Opt level: O0

result<std::tuple<toml::local_time,_toml::local_time_format_info,_toml::detail::region>,_toml::error_info>
* toml::detail::parse_local_time_only<toml::type_config>
            (location *loc,context<toml::type_config> *ctx)

{
  int us_00;
  bool bVar1;
  value_type *pvVar2;
  size_type sVar3;
  location *loc_00;
  local_time *__args;
  context<toml::type_config> *in_RDX;
  result<std::tuple<toml::local_time,_toml::local_time_format_info,_toml::detail::region>,_toml::error_info>
  *in_RDI;
  value_type ns;
  value_type us;
  value_type ms;
  source_location src_7;
  source_location src_6;
  source_location src_5;
  result<int,_toml::detail::none_t> ns_r;
  result<int,_toml::detail::none_t> us_r;
  result<int,_toml::detail::none_t> ms_r;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> secfrac;
  source_location src_4;
  value_type sec;
  source_location src_3;
  result<int,_toml::detail::none_t> sec_r;
  source_location src_2;
  value_type minute;
  value_type hour;
  source_location src_1;
  source_location src;
  result<int,_toml::detail::none_t> minute_r;
  result<int,_toml::detail::none_t> hour_r;
  string str;
  region reg;
  local_time_format_info fmt;
  spec *spec;
  location first;
  undefined4 in_stack_ffffffffffffe228;
  undefined4 uVar4;
  int ns_00;
  undefined4 in_stack_ffffffffffffe22c;
  result<std::tuple<toml::local_time,_toml::local_time_format_info,_toml::detail::region>,_toml::error_info>
  *in_stack_ffffffffffffe230;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffe238;
  size_type in_stack_ffffffffffffe240;
  location *in_stack_ffffffffffffe248;
  location *in_stack_ffffffffffffe250;
  allocator<char> *in_stack_ffffffffffffe260;
  allocator<char> *__a;
  char *in_stack_ffffffffffffe268;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffe270;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this;
  region *in_stack_ffffffffffffe288;
  error_info *v;
  source_location in_stack_ffffffffffffe290;
  location *in_stack_ffffffffffffe298;
  region *in_stack_ffffffffffffe2a0;
  region *in_stack_ffffffffffffe2a8;
  source_location *in_stack_ffffffffffffe2b0;
  tuple<toml::local_time,_toml::local_time_format_info,_toml::detail::region>
  *in_stack_ffffffffffffe2b8;
  location *in_stack_ffffffffffffe320;
  result<std::tuple<toml::local_time,_toml::local_time_format_info,_toml::detail::region>,_toml::error_info>
  *this_00;
  local_time local_1cc2 [17];
  string *in_stack_ffffffffffffe3e8;
  source_location *in_stack_ffffffffffffe3f0;
  string *in_stack_ffffffffffffe3f8;
  undefined4 in_stack_ffffffffffffe480;
  value_type ms_00;
  undefined4 in_stack_ffffffffffffe484;
  location *in_stack_ffffffffffffe488;
  sequence *in_stack_ffffffffffffe490;
  string *in_stack_ffffffffffffe498;
  allocator<char> local_18e9 [656];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1659 [21];
  result<int,_toml::detail::none_t> local_13b0 [5];
  result<int,_toml::detail::none_t> local_1388 [5];
  result<int,_toml::detail::none_t> local_1360;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1358;
  local_time local_1332 [28];
  error_info local_1211;
  allocator<char> local_1171 [433];
  undefined **local_fc0;
  int local_fb8;
  allocator<char> local_fb1 [685];
  result<int,_toml::detail::none_t> local_d04;
  local_time local_cfa [28];
  allocator<char> local_bd9 [160];
  allocator<char> local_b39 [433];
  undefined **local_988;
  int local_97c;
  undefined **local_978;
  int local_970;
  allocator<char> local_969 [656];
  allocator<char> local_6d9 [681];
  result<int,_toml::detail::none_t> local_430 [5];
  result<int,_toml::detail::none_t> local_408;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_400;
  allocator<char> local_3d9 [144];
  allocator<char> local_349 [209];
  undefined4 local_278;
  allocator<char> local_271 [144];
  allocator<char> local_1e1 [361];
  local_time_format_info local_78;
  spec *local_68;
  context<toml::type_config> *local_18;
  
  this_00 = in_RDI;
  local_18 = in_RDX;
  location::location(in_stack_ffffffffffffe250,in_stack_ffffffffffffe248);
  local_68 = context<toml::type_config>::toml_spec(local_18);
  local_time_format_info::local_time_format_info(&local_78);
  syntax::local_time((spec *)in_stack_ffffffffffffe488);
  sequence::scan((sequence *)this_00,in_stack_ffffffffffffe320);
  sequence::~sequence((sequence *)in_stack_ffffffffffffe230);
  bVar1 = region::is_ok((region *)0x688969);
  if (bVar1) {
    region::as_string_abi_cxx11_(in_stack_ffffffffffffe288);
    CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffffe248,in_stack_ffffffffffffe240,
               (size_type)in_stack_ffffffffffffe238);
    from_string<int>(in_stack_ffffffffffffe3e8);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffffe230);
    CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffffe248,in_stack_ffffffffffffe240,
               (size_type)in_stack_ffffffffffffe238);
    from_string<int>(in_stack_ffffffffffffe3e8);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffffe230);
    bVar1 = result<int,_toml::detail::none_t>::is_err(&local_408);
    if (bVar1) {
      region::region(in_stack_ffffffffffffe2a0,in_stack_ffffffffffffe298);
      source_location::source_location(in_stack_ffffffffffffe2b0,in_stack_ffffffffffffe2a8);
      region::~region((region *)in_stack_ffffffffffffe230);
      CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_ffffffffffffe248,in_stack_ffffffffffffe240,
                 (size_type)in_stack_ffffffffffffe238);
      std::operator+((char *)in_stack_ffffffffffffe238,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_ffffffffffffe230);
      std::operator+(in_stack_ffffffffffffe238,&in_stack_ffffffffffffe230->is_ok_);
      source_location::source_location
                ((source_location *)in_stack_ffffffffffffe230,
                 (source_location *)CONCAT44(in_stack_ffffffffffffe22c,in_stack_ffffffffffffe228));
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_ffffffffffffe270,in_stack_ffffffffffffe268,in_stack_ffffffffffffe260);
      make_error_info<>(in_stack_ffffffffffffe3f8,in_stack_ffffffffffffe3f0,
                        in_stack_ffffffffffffe3e8);
      err<toml::error_info>((error_info *)in_stack_ffffffffffffe288);
      result<std::tuple<toml::local_time,_toml::local_time_format_info,_toml::detail::region>,_toml::error_info>
      ::result(in_stack_ffffffffffffe230,
               (failure_type *)CONCAT44(in_stack_ffffffffffffe22c,in_stack_ffffffffffffe228));
      failure<toml::error_info>::~failure((failure<toml::error_info> *)0x68908d);
      error_info::~error_info((error_info *)in_stack_ffffffffffffe230);
      std::__cxx11::string::~string
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_ffffffffffffe230);
      std::allocator<char>::~allocator(local_6d9);
      source_location::~source_location((source_location *)in_stack_ffffffffffffe230);
      std::__cxx11::string::~string
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_ffffffffffffe230);
      std::__cxx11::string::~string
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_ffffffffffffe230);
      std::__cxx11::string::~string
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_ffffffffffffe230);
      local_278 = 1;
      source_location::~source_location((source_location *)in_stack_ffffffffffffe230);
    }
    else {
      bVar1 = result<int,_toml::detail::none_t>::is_err(local_430);
      if (bVar1) {
        region::region(in_stack_ffffffffffffe2a0,in_stack_ffffffffffffe298);
        source_location::source_location(in_stack_ffffffffffffe2b0,in_stack_ffffffffffffe2a8);
        region::~region((region *)in_stack_ffffffffffffe230);
        CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_ffffffffffffe248,in_stack_ffffffffffffe240,
                   (size_type)in_stack_ffffffffffffe238);
        std::operator+((char *)in_stack_ffffffffffffe238,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       in_stack_ffffffffffffe230);
        std::operator+(in_stack_ffffffffffffe238,&in_stack_ffffffffffffe230->is_ok_);
        source_location::source_location
                  ((source_location *)in_stack_ffffffffffffe230,
                   (source_location *)CONCAT44(in_stack_ffffffffffffe22c,in_stack_ffffffffffffe228))
        ;
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  (in_stack_ffffffffffffe270,in_stack_ffffffffffffe268,in_stack_ffffffffffffe260);
        make_error_info<>(in_stack_ffffffffffffe3f8,in_stack_ffffffffffffe3f0,
                          in_stack_ffffffffffffe3e8);
        err<toml::error_info>((error_info *)in_stack_ffffffffffffe288);
        result<std::tuple<toml::local_time,_toml::local_time_format_info,_toml::detail::region>,_toml::error_info>
        ::result(in_stack_ffffffffffffe230,
                 (failure_type *)CONCAT44(in_stack_ffffffffffffe22c,in_stack_ffffffffffffe228));
        failure<toml::error_info>::~failure((failure<toml::error_info> *)0x68943e);
        error_info::~error_info((error_info *)in_stack_ffffffffffffe230);
        std::__cxx11::string::~string
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_ffffffffffffe230);
        std::allocator<char>::~allocator(local_969);
        source_location::~source_location((source_location *)in_stack_ffffffffffffe230);
        std::__cxx11::string::~string
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_ffffffffffffe230);
        std::__cxx11::string::~string
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_ffffffffffffe230);
        std::__cxx11::string::~string
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_ffffffffffffe230);
        local_278 = 1;
        source_location::~source_location((source_location *)in_stack_ffffffffffffe230);
      }
      else {
        local_978 = &PTR_s__workspace_llm4binary_github_lic_0093b1a8;
        pvVar2 = result<int,_toml::detail::none_t>::unwrap
                           ((result<int,_toml::detail::none_t> *)in_stack_ffffffffffffe288,
                            in_stack_ffffffffffffe290);
        local_970 = *pvVar2;
        local_988 = &PTR_s__workspace_llm4binary_github_lic_0093b1c0;
        pvVar2 = result<int,_toml::detail::none_t>::unwrap
                           ((result<int,_toml::detail::none_t> *)in_stack_ffffffffffffe288,
                            in_stack_ffffffffffffe290);
        local_97c = *pvVar2;
        if ((((local_970 < 0) || (0x17 < local_970)) || (local_97c < 0)) || (0x3b < local_97c)) {
          region::region(in_stack_ffffffffffffe2a0,in_stack_ffffffffffffe298);
          source_location::source_location(in_stack_ffffffffffffe2b0,in_stack_ffffffffffffe2a8);
          region::~region((region *)in_stack_ffffffffffffe230);
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    (in_stack_ffffffffffffe270,in_stack_ffffffffffffe268,in_stack_ffffffffffffe260);
          source_location::source_location
                    ((source_location *)in_stack_ffffffffffffe230,
                     (source_location *)
                     CONCAT44(in_stack_ffffffffffffe22c,in_stack_ffffffffffffe228));
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    (in_stack_ffffffffffffe270,in_stack_ffffffffffffe268,in_stack_ffffffffffffe260);
          make_error_info<>(in_stack_ffffffffffffe3f8,in_stack_ffffffffffffe3f0,
                            in_stack_ffffffffffffe3e8);
          err<toml::error_info>((error_info *)in_stack_ffffffffffffe288);
          result<std::tuple<toml::local_time,_toml::local_time_format_info,_toml::detail::region>,_toml::error_info>
          ::result(in_stack_ffffffffffffe230,
                   (failure_type *)CONCAT44(in_stack_ffffffffffffe22c,in_stack_ffffffffffffe228));
          failure<toml::error_info>::~failure((failure<toml::error_info> *)0x6897b1);
          error_info::~error_info((error_info *)in_stack_ffffffffffffe230);
          std::__cxx11::string::~string
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_ffffffffffffe230);
          std::allocator<char>::~allocator(local_bd9);
          source_location::~source_location((source_location *)in_stack_ffffffffffffe230);
          std::__cxx11::string::~string
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_ffffffffffffe230);
          std::allocator<char>::~allocator(local_b39);
          local_278 = 1;
          source_location::~source_location((source_location *)in_stack_ffffffffffffe230);
        }
        else {
          sVar3 = CLI::std::__cxx11::
                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::size
                            (&local_400);
          if ((sVar3 == 5) && ((local_68->v1_1_0_make_seconds_optional & 1U) != 0)) {
            local_78.has_seconds = false;
            local_78.subsecond_precision = 0;
            uVar4 = 0;
            local_time::local_time(local_cfa,local_970,local_97c,0,0,0,0);
            std::make_tuple<toml::local_time,toml::local_time_format_info,toml::detail::region>
                      ((local_time *)in_stack_ffffffffffffe238,
                       (local_time_format_info *)in_stack_ffffffffffffe230,
                       (region *)CONCAT44(in_stack_ffffffffffffe22c,uVar4));
            ok<std::tuple<toml::local_time,toml::local_time_format_info,toml::detail::region>>
                      (in_stack_ffffffffffffe2b8);
            result<std::tuple<toml::local_time,_toml::local_time_format_info,_toml::detail::region>,_toml::error_info>
            ::result(in_stack_ffffffffffffe230,
                     (success_type *)CONCAT44(in_stack_ffffffffffffe22c,uVar4));
            success<std::tuple<toml::local_time,_toml::local_time_format_info,_toml::detail::region>_>
            ::~success((success<std::tuple<toml::local_time,_toml::local_time_format_info,_toml::detail::region>_>
                        *)0x6899d6);
            std::tuple<toml::local_time,_toml::local_time_format_info,_toml::detail::region>::~tuple
                      ((tuple<toml::local_time,_toml::local_time_format_info,_toml::detail::region>
                        *)0x6899e3);
            local_278 = 1;
          }
          else {
            CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
            substr((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_ffffffffffffe248,in_stack_ffffffffffffe240,
                   (size_type)in_stack_ffffffffffffe238);
            from_string<int>(in_stack_ffffffffffffe3e8);
            std::__cxx11::string::~string
                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       in_stack_ffffffffffffe230);
            bVar1 = result<int,_toml::detail::none_t>::is_err(&local_d04);
            if (bVar1) {
              region::region(in_stack_ffffffffffffe2a0,in_stack_ffffffffffffe298);
              source_location::source_location(in_stack_ffffffffffffe2b0,in_stack_ffffffffffffe2a8);
              region::~region((region *)in_stack_ffffffffffffe230);
              CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
              substr((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_ffffffffffffe248,in_stack_ffffffffffffe240,
                     (size_type)in_stack_ffffffffffffe238);
              std::operator+((char *)in_stack_ffffffffffffe238,
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             in_stack_ffffffffffffe230);
              std::operator+(in_stack_ffffffffffffe238,&in_stack_ffffffffffffe230->is_ok_);
              source_location::source_location
                        ((source_location *)in_stack_ffffffffffffe230,
                         (source_location *)
                         CONCAT44(in_stack_ffffffffffffe22c,in_stack_ffffffffffffe228));
              std::allocator<char>::allocator();
              std::__cxx11::string::string<std::allocator<char>>
                        (in_stack_ffffffffffffe270,in_stack_ffffffffffffe268,
                         in_stack_ffffffffffffe260);
              make_error_info<>(in_stack_ffffffffffffe3f8,in_stack_ffffffffffffe3f0,
                                in_stack_ffffffffffffe3e8);
              err<toml::error_info>((error_info *)in_stack_ffffffffffffe288);
              result<std::tuple<toml::local_time,_toml::local_time_format_info,_toml::detail::region>,_toml::error_info>
              ::result(in_stack_ffffffffffffe230,
                       (failure_type *)CONCAT44(in_stack_ffffffffffffe22c,in_stack_ffffffffffffe228)
                      );
              failure<toml::error_info>::~failure((failure<toml::error_info> *)0x689bd9);
              error_info::~error_info((error_info *)in_stack_ffffffffffffe230);
              std::__cxx11::string::~string
                        ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         in_stack_ffffffffffffe230);
              std::allocator<char>::~allocator(local_fb1);
              source_location::~source_location((source_location *)in_stack_ffffffffffffe230);
              std::__cxx11::string::~string
                        ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         in_stack_ffffffffffffe230);
              std::__cxx11::string::~string
                        ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         in_stack_ffffffffffffe230);
              std::__cxx11::string::~string
                        ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         in_stack_ffffffffffffe230);
              local_278 = 1;
              source_location::~source_location((source_location *)in_stack_ffffffffffffe230);
            }
            else {
              local_fc0 = &PTR_s__workspace_llm4binary_github_lic_0093b1d8;
              loc_00 = (location *)
                       result<int,_toml::detail::none_t>::unwrap
                                 ((result<int,_toml::detail::none_t> *)in_stack_ffffffffffffe288,
                                  in_stack_ffffffffffffe290);
              local_fb8 = *(int *)&(loc_00->source_).
                                   super___shared_ptr<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2>
                                   ._M_ptr;
              if ((local_fb8 < 0) || (0x3c < local_fb8)) {
                region::region(in_stack_ffffffffffffe2a0,loc_00);
                source_location::source_location
                          (in_stack_ffffffffffffe2b0,in_stack_ffffffffffffe2a8);
                region::~region((region *)in_stack_ffffffffffffe230);
                std::allocator<char>::allocator();
                std::__cxx11::string::string<std::allocator<char>>
                          (in_stack_ffffffffffffe270,in_stack_ffffffffffffe268,
                           in_stack_ffffffffffffe260);
                source_location::source_location
                          ((source_location *)in_stack_ffffffffffffe230,
                           (source_location *)
                           CONCAT44(in_stack_ffffffffffffe22c,in_stack_ffffffffffffe228));
                v = &local_1211;
                std::allocator<char>::allocator();
                std::__cxx11::string::string<std::allocator<char>>
                          (in_stack_ffffffffffffe270,in_stack_ffffffffffffe268,
                           in_stack_ffffffffffffe260);
                make_error_info<>(in_stack_ffffffffffffe3f8,in_stack_ffffffffffffe3f0,
                                  in_stack_ffffffffffffe3e8);
                err<toml::error_info>(v);
                result<std::tuple<toml::local_time,_toml::local_time_format_info,_toml::detail::region>,_toml::error_info>
                ::result(in_stack_ffffffffffffe230,
                         (failure_type *)
                         CONCAT44(in_stack_ffffffffffffe22c,in_stack_ffffffffffffe228));
                failure<toml::error_info>::~failure((failure<toml::error_info> *)0x689f1c);
                error_info::~error_info((error_info *)in_stack_ffffffffffffe230);
                std::__cxx11::string::~string
                          ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           in_stack_ffffffffffffe230);
                std::allocator<char>::~allocator((allocator<char> *)&local_1211);
                source_location::~source_location((source_location *)in_stack_ffffffffffffe230);
                std::__cxx11::string::~string
                          ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           in_stack_ffffffffffffe230);
                std::allocator<char>::~allocator(local_1171);
                local_278 = 1;
                source_location::~source_location((source_location *)in_stack_ffffffffffffe230);
              }
              else {
                sVar3 = CLI::std::__cxx11::
                        basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::size
                                  (&local_400);
                if (sVar3 == 8) {
                  local_78.has_seconds = true;
                  local_78.subsecond_precision = 0;
                  uVar4 = 0;
                  local_time::local_time(local_1332,local_970,local_97c,local_fb8,0,0,0);
                  std::
                  make_tuple<toml::local_time,toml::local_time_format_info,toml::detail::region>
                            ((local_time *)in_stack_ffffffffffffe238,
                             (local_time_format_info *)in_stack_ffffffffffffe230,
                             (region *)CONCAT44(in_stack_ffffffffffffe22c,uVar4));
                  ok<std::tuple<toml::local_time,toml::local_time_format_info,toml::detail::region>>
                            (in_stack_ffffffffffffe2b8);
                  result<std::tuple<toml::local_time,_toml::local_time_format_info,_toml::detail::region>,_toml::error_info>
                  ::result(in_stack_ffffffffffffe230,
                           (success_type *)CONCAT44(in_stack_ffffffffffffe22c,uVar4));
                  success<std::tuple<toml::local_time,_toml::local_time_format_info,_toml::detail::region>_>
                  ::~success((success<std::tuple<toml::local_time,_toml::local_time_format_info,_toml::detail::region>_>
                              *)0x68a133);
                  std::tuple<toml::local_time,_toml::local_time_format_info,_toml::detail::region>::
                  ~tuple((tuple<toml::local_time,_toml::local_time_format_info,_toml::detail::region>
                          *)0x68a140);
                  local_278 = 1;
                }
                else {
                  CLI::std::__cxx11::
                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::size
                            (&local_400);
                  CLI::std::__cxx11::
                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
                            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             in_stack_ffffffffffffe248,in_stack_ffffffffffffe240,
                             (size_type)in_stack_ffffffffffffe238);
                  local_78.has_seconds = true;
                  local_78.subsecond_precision =
                       CLI::std::__cxx11::
                       basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::size
                                 (&local_1358);
                  while( true ) {
                    sVar3 = CLI::std::__cxx11::
                            basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::size
                                      (&local_1358);
                    if (8 < sVar3) break;
                    CLI::std::__cxx11::
                    basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator+=
                              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               in_stack_ffffffffffffe230,
                               (char)((uint)in_stack_ffffffffffffe22c >> 0x18));
                  }
                  CLI::std::__cxx11::
                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
                            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             in_stack_ffffffffffffe248,in_stack_ffffffffffffe240,
                             (size_type)in_stack_ffffffffffffe238);
                  from_string<int>(in_stack_ffffffffffffe3e8);
                  std::__cxx11::string::~string
                            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             in_stack_ffffffffffffe230);
                  CLI::std::__cxx11::
                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
                            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             in_stack_ffffffffffffe248,in_stack_ffffffffffffe240,
                             (size_type)in_stack_ffffffffffffe238);
                  from_string<int>(in_stack_ffffffffffffe3e8);
                  std::__cxx11::string::~string
                            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             in_stack_ffffffffffffe230);
                  CLI::std::__cxx11::
                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
                            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             in_stack_ffffffffffffe248,in_stack_ffffffffffffe240,
                             (size_type)in_stack_ffffffffffffe238);
                  from_string<int>(in_stack_ffffffffffffe3e8);
                  std::__cxx11::string::~string
                            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             in_stack_ffffffffffffe230);
                  bVar1 = result<int,_toml::detail::none_t>::is_err(&local_1360);
                  if (bVar1) {
                    region::region(in_stack_ffffffffffffe2a0,loc_00);
                    source_location::source_location
                              (in_stack_ffffffffffffe2b0,in_stack_ffffffffffffe2a8);
                    region::~region((region *)in_stack_ffffffffffffe230);
                    CLI::std::__cxx11::
                    basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
                              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               in_stack_ffffffffffffe248,in_stack_ffffffffffffe240,
                               (size_type)in_stack_ffffffffffffe238);
                    std::operator+((char *)in_stack_ffffffffffffe238,
                                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)in_stack_ffffffffffffe230);
                    std::operator+(in_stack_ffffffffffffe238,&in_stack_ffffffffffffe230->is_ok_);
                    source_location::source_location
                              ((source_location *)in_stack_ffffffffffffe230,
                               (source_location *)
                               CONCAT44(in_stack_ffffffffffffe22c,in_stack_ffffffffffffe228));
                    this = local_1659;
                    std::allocator<char>::allocator();
                    std::__cxx11::string::string<std::allocator<char>>
                              (this,in_stack_ffffffffffffe268,in_stack_ffffffffffffe260);
                    make_error_info<>(in_stack_ffffffffffffe3f8,in_stack_ffffffffffffe3f0,
                                      in_stack_ffffffffffffe3e8);
                    err<toml::error_info>((error_info *)in_stack_ffffffffffffe288);
                    result<std::tuple<toml::local_time,_toml::local_time_format_info,_toml::detail::region>,_toml::error_info>
                    ::result(in_stack_ffffffffffffe230,
                             (failure_type *)
                             CONCAT44(in_stack_ffffffffffffe22c,in_stack_ffffffffffffe228));
                    failure<toml::error_info>::~failure((failure<toml::error_info> *)0x68a447);
                    error_info::~error_info((error_info *)in_stack_ffffffffffffe230);
                    std::__cxx11::string::~string
                              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               in_stack_ffffffffffffe230);
                    std::allocator<char>::~allocator((allocator<char> *)local_1659);
                    source_location::~source_location((source_location *)in_stack_ffffffffffffe230);
                    std::__cxx11::string::~string
                              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               in_stack_ffffffffffffe230);
                    std::__cxx11::string::~string
                              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               in_stack_ffffffffffffe230);
                    std::__cxx11::string::~string
                              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               in_stack_ffffffffffffe230);
                    local_278 = 1;
                    source_location::~source_location((source_location *)in_stack_ffffffffffffe230);
                  }
                  else {
                    bVar1 = result<int,_toml::detail::none_t>::is_err(local_1388);
                    if (bVar1) {
                      region::region(in_stack_ffffffffffffe2a0,loc_00);
                      source_location::source_location
                                (in_stack_ffffffffffffe2b0,in_stack_ffffffffffffe2a8);
                      region::~region((region *)in_stack_ffffffffffffe230);
                      CLI::std::__cxx11::
                      basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
                                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)in_stack_ffffffffffffe248,in_stack_ffffffffffffe240,
                                 (size_type)in_stack_ffffffffffffe238);
                      std::operator+((char *)in_stack_ffffffffffffe238,
                                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                      *)in_stack_ffffffffffffe230);
                      std::operator+(in_stack_ffffffffffffe238,&in_stack_ffffffffffffe230->is_ok_);
                      source_location::source_location
                                ((source_location *)in_stack_ffffffffffffe230,
                                 (source_location *)
                                 CONCAT44(in_stack_ffffffffffffe22c,in_stack_ffffffffffffe228));
                      __a = local_18e9;
                      std::allocator<char>::allocator();
                      std::__cxx11::string::string<std::allocator<char>>
                                (in_stack_ffffffffffffe270,in_stack_ffffffffffffe268,__a);
                      make_error_info<>(in_stack_ffffffffffffe3f8,in_stack_ffffffffffffe3f0,
                                        in_stack_ffffffffffffe3e8);
                      err<toml::error_info>((error_info *)in_stack_ffffffffffffe288);
                      result<std::tuple<toml::local_time,_toml::local_time_format_info,_toml::detail::region>,_toml::error_info>
                      ::result(in_stack_ffffffffffffe230,
                               (failure_type *)
                               CONCAT44(in_stack_ffffffffffffe22c,in_stack_ffffffffffffe228));
                      failure<toml::error_info>::~failure((failure<toml::error_info> *)0x68a7f7);
                      error_info::~error_info((error_info *)in_stack_ffffffffffffe230);
                      std::__cxx11::string::~string
                                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)in_stack_ffffffffffffe230);
                      std::allocator<char>::~allocator((allocator<char> *)local_18e9);
                      source_location::~source_location
                                ((source_location *)in_stack_ffffffffffffe230);
                      std::__cxx11::string::~string
                                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)in_stack_ffffffffffffe230);
                      std::__cxx11::string::~string
                                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)in_stack_ffffffffffffe230);
                      std::__cxx11::string::~string
                                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)in_stack_ffffffffffffe230);
                      local_278 = 1;
                      source_location::~source_location
                                ((source_location *)in_stack_ffffffffffffe230);
                    }
                    else {
                      bVar1 = result<int,_toml::detail::none_t>::is_err(local_13b0);
                      if (bVar1) {
                        region::region(in_stack_ffffffffffffe2a0,loc_00);
                        source_location::source_location
                                  (in_stack_ffffffffffffe2b0,in_stack_ffffffffffffe2a8);
                        region::~region((region *)in_stack_ffffffffffffe230);
                        CLI::std::__cxx11::
                        basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
                                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)in_stack_ffffffffffffe248,in_stack_ffffffffffffe240,
                                   (size_type)in_stack_ffffffffffffe238);
                        std::operator+((char *)in_stack_ffffffffffffe238,
                                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                        *)in_stack_ffffffffffffe230);
                        std::operator+(in_stack_ffffffffffffe238,&in_stack_ffffffffffffe230->is_ok_)
                        ;
                        source_location::source_location
                                  ((source_location *)in_stack_ffffffffffffe230,
                                   (source_location *)
                                   CONCAT44(in_stack_ffffffffffffe22c,in_stack_ffffffffffffe228));
                        std::allocator<char>::allocator();
                        std::__cxx11::string::string<std::allocator<char>>
                                  (in_stack_ffffffffffffe270,in_stack_ffffffffffffe268,
                                   in_stack_ffffffffffffe260);
                        make_error_info<>(in_stack_ffffffffffffe3f8,in_stack_ffffffffffffe3f0,
                                          in_stack_ffffffffffffe3e8);
                        err<toml::error_info>((error_info *)in_stack_ffffffffffffe288);
                        result<std::tuple<toml::local_time,_toml::local_time_format_info,_toml::detail::region>,_toml::error_info>
                        ::result(in_stack_ffffffffffffe230,
                                 (failure_type *)
                                 CONCAT44(in_stack_ffffffffffffe22c,in_stack_ffffffffffffe228));
                        failure<toml::error_info>::~failure((failure<toml::error_info> *)0x68aaec);
                        error_info::~error_info((error_info *)in_stack_ffffffffffffe230);
                        std::__cxx11::string::~string
                                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)in_stack_ffffffffffffe230);
                        std::allocator<char>::~allocator
                                  ((allocator<char> *)&stack0xffffffffffffe487);
                        source_location::~source_location
                                  ((source_location *)in_stack_ffffffffffffe230);
                        std::__cxx11::string::~string
                                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)in_stack_ffffffffffffe230);
                        std::__cxx11::string::~string
                                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)in_stack_ffffffffffffe230);
                        std::__cxx11::string::~string
                                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)in_stack_ffffffffffffe230);
                        local_278 = 1;
                        source_location::~source_location
                                  ((source_location *)in_stack_ffffffffffffe230);
                      }
                      else {
                        pvVar2 = result<int,_toml::detail::none_t>::unwrap
                                           ((result<int,_toml::detail::none_t> *)
                                            in_stack_ffffffffffffe288,in_stack_ffffffffffffe290);
                        ms_00 = *pvVar2;
                        __args = (local_time *)
                                 result<int,_toml::detail::none_t>::unwrap
                                           ((result<int,_toml::detail::none_t> *)
                                            in_stack_ffffffffffffe288,in_stack_ffffffffffffe290);
                        us_00._0_1_ = __args->hour;
                        us_00._1_1_ = __args->minute;
                        us_00._2_1_ = __args->second;
                        us_00._3_1_ = __args->field_0x3;
                        in_stack_ffffffffffffe230 =
                             (result<std::tuple<toml::local_time,_toml::local_time_format_info,_toml::detail::region>,_toml::error_info>
                              *)result<int,_toml::detail::none_t>::unwrap
                                          ((result<int,_toml::detail::none_t> *)
                                           in_stack_ffffffffffffe288,in_stack_ffffffffffffe290);
                        ns_00 = *(int *)in_stack_ffffffffffffe230;
                        local_time::local_time
                                  (local_1cc2,local_970,local_97c,local_fb8,ms_00,us_00,ns_00);
                        std::
                        make_tuple<toml::local_time,toml::local_time_format_info,toml::detail::region>
                                  (__args,(local_time_format_info *)in_stack_ffffffffffffe230,
                                   (region *)CONCAT44(in_stack_ffffffffffffe22c,ns_00));
                        ok<std::tuple<toml::local_time,toml::local_time_format_info,toml::detail::region>>
                                  (in_stack_ffffffffffffe2b8);
                        result<std::tuple<toml::local_time,_toml::local_time_format_info,_toml::detail::region>,_toml::error_info>
                        ::result(in_stack_ffffffffffffe230,
                                 (success_type *)CONCAT44(in_stack_ffffffffffffe22c,ns_00));
                        success<std::tuple<toml::local_time,_toml::local_time_format_info,_toml::detail::region>_>
                        ::~success((success<std::tuple<toml::local_time,_toml::local_time_format_info,_toml::detail::region>_>
                                    *)0x68addc);
                        std::
                        tuple<toml::local_time,_toml::local_time_format_info,_toml::detail::region>
                        ::~tuple((tuple<toml::local_time,_toml::local_time_format_info,_toml::detail::region>
                                  *)0x68ade9);
                        local_278 = 1;
                      }
                    }
                  }
                  result<int,_toml::detail::none_t>::~result
                            ((result<int,_toml::detail::none_t> *)0x68ae49);
                  result<int,_toml::detail::none_t>::~result
                            ((result<int,_toml::detail::none_t> *)0x68ae56);
                  result<int,_toml::detail::none_t>::~result
                            ((result<int,_toml::detail::none_t> *)0x68ae63);
                  std::__cxx11::string::~string
                            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             in_stack_ffffffffffffe230);
                }
              }
            }
            result<int,_toml::detail::none_t>::~result
                      ((result<int,_toml::detail::none_t> *)0x68aeb5);
          }
        }
      }
    }
    result<int,_toml::detail::none_t>::~result((result<int,_toml::detail::none_t> *)0x68aed3);
    result<int,_toml::detail::none_t>::~result((result<int,_toml::detail::none_t> *)0x68aee0);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffffe230);
  }
  else if ((local_68->v1_1_0_make_seconds_optional & 1U) == 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffffe270,in_stack_ffffffffffffe268,in_stack_ffffffffffffe260);
    syntax::local_time((spec *)in_stack_ffffffffffffe488);
    location::location(in_stack_ffffffffffffe250,in_stack_ffffffffffffe248);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffffe270,in_stack_ffffffffffffe268,in_stack_ffffffffffffe260);
    make_syntax_error<toml::detail::sequence>
              (in_stack_ffffffffffffe498,in_stack_ffffffffffffe490,in_stack_ffffffffffffe488,
               (string *)CONCAT44(in_stack_ffffffffffffe484,in_stack_ffffffffffffe480));
    err<toml::error_info>((error_info *)in_stack_ffffffffffffe288);
    result<std::tuple<toml::local_time,_toml::local_time_format_info,_toml::detail::region>,_toml::error_info>
    ::result(in_stack_ffffffffffffe230,
             (failure_type *)CONCAT44(in_stack_ffffffffffffe22c,in_stack_ffffffffffffe228));
    failure<toml::error_info>::~failure((failure<toml::error_info> *)0x688d2d);
    error_info::~error_info((error_info *)in_stack_ffffffffffffe230);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffffe230);
    std::allocator<char>::~allocator(local_3d9);
    location::~location((location *)in_stack_ffffffffffffe230);
    sequence::~sequence((sequence *)in_stack_ffffffffffffe230);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffffe230);
    std::allocator<char>::~allocator(local_349);
    local_278 = 1;
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffffe270,in_stack_ffffffffffffe268,in_stack_ffffffffffffe260);
    syntax::local_time((spec *)in_stack_ffffffffffffe488);
    location::location(in_stack_ffffffffffffe250,in_stack_ffffffffffffe248);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffffe270,in_stack_ffffffffffffe268,in_stack_ffffffffffffe260);
    make_syntax_error<toml::detail::sequence>
              (in_stack_ffffffffffffe498,in_stack_ffffffffffffe490,in_stack_ffffffffffffe488,
               (string *)CONCAT44(in_stack_ffffffffffffe484,in_stack_ffffffffffffe480));
    err<toml::error_info>((error_info *)in_stack_ffffffffffffe288);
    result<std::tuple<toml::local_time,_toml::local_time_format_info,_toml::detail::region>,_toml::error_info>
    ::result(in_stack_ffffffffffffe230,
             (failure_type *)CONCAT44(in_stack_ffffffffffffe22c,in_stack_ffffffffffffe228));
    failure<toml::error_info>::~failure((failure<toml::error_info> *)0x688a87);
    error_info::~error_info((error_info *)in_stack_ffffffffffffe230);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffffe230);
    std::allocator<char>::~allocator(local_271);
    location::~location((location *)in_stack_ffffffffffffe230);
    sequence::~sequence((sequence *)in_stack_ffffffffffffe230);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffffe230);
    std::allocator<char>::~allocator(local_1e1);
    local_278 = 1;
  }
  region::~region((region *)in_stack_ffffffffffffe230);
  location::~location((location *)in_stack_ffffffffffffe230);
  return in_RDI;
}

Assistant:

result<std::tuple<local_time, local_time_format_info, region>, error_info>
parse_local_time_only(location& loc, const context<TC>& ctx)
{
    const auto first = loc;
    const auto& spec = ctx.toml_spec();

    local_time_format_info fmt;

    // ----------------------------------------------------------------------
    // check syntax
    auto reg = syntax::local_time(spec).scan(loc);
    if( ! reg.is_ok())
    {
        if(spec.v1_1_0_make_seconds_optional)
        {
            return err(make_syntax_error("toml::parse_local_time: "
                "invalid time: time must be HH:MM(:SS.sss) (seconds are optional)",
                syntax::local_time(spec), loc));
        }
        else
        {
            return err(make_syntax_error("toml::parse_local_time: "
                "invalid time: time must be HH:MM:SS(.sss) (subseconds are optional)",
                syntax::local_time(spec), loc));
        }
    }

    // ----------------------------------------------------------------------
    // it matches. gen value
    const auto str = reg.as_string();

    // at least we have HH:MM.
    // 01234
    // HH:MM
    const auto hour_r   = from_string<int>(str.substr(0, 2));
    const auto minute_r = from_string<int>(str.substr(3, 2));

    if(hour_r.is_err())
    {
        auto src = source_location(region(first));
        return err(make_error_info("toml::parse_local_time: "
            "failed to read hour `" + str.substr(0, 2) + "`",
            std::move(src), "here"));
    }
    if(minute_r.is_err())
    {
        auto src = source_location(region(first));
        return err(make_error_info("toml::parse_local_time: "
            "failed to read minute `" + str.substr(3, 2) + "`",
            std::move(src), "here"));
    }

    const auto hour   = hour_r.unwrap();
    const auto minute = minute_r.unwrap();

    if((hour < 0 || 24 <= hour) || (minute < 0 || 60 <= minute))
    {
        auto src = source_location(region(first));
        return err(make_error_info("toml::parse_local_time: invalid time.",
            std::move(src), "hour must be 00-23, minute must be 00-59."));
    }

    // -----------------------------------------------------------------------
    // we have hour and minute.
    // Since toml v1.1.0, second and subsecond part becomes optional.
    // Check the version and return if second does not exist.

    if(str.size() == 5 && spec.v1_1_0_make_seconds_optional)
    {
        fmt.has_seconds = false;
        fmt.subsecond_precision = 0;
        return ok(std::make_tuple(local_time(hour, minute, 0), std::move(fmt), std::move(reg)));
    }
    assert(str.at(5) == ':');

    // we have at least `:SS` part. `.subseconds` are optional.

    // 0         1
    // 012345678901234
    // HH:MM:SS.subsec
    const auto sec_r = from_string<int>(str.substr(6, 2));
    if(sec_r.is_err())
    {
        auto src = source_location(region(first));
        return err(make_error_info("toml::parse_local_time: "
            "failed to read second `" + str.substr(6, 2) + "`",
            std::move(src), "here"));
    }
    const auto sec = sec_r.unwrap();

    if(sec < 0 || 60 < sec) // :60 is allowed
    {
        auto src = source_location(region(first));
        return err(make_error_info("toml::parse_local_time: invalid time.",
                    std::move(src), "second must be 00-60."));
    }

    if(str.size() == 8)
    {
        fmt.has_seconds = true;
        fmt.subsecond_precision = 0;
        return ok(std::make_tuple(local_time(hour, minute, sec), std::move(fmt), std::move(reg)));
    }

    assert(str.at(8) == '.');

    auto secfrac = str.substr(9, str.size() - 9);

    fmt.has_seconds = true;
    fmt.subsecond_precision = secfrac.size();

    while(secfrac.size() < 9)
    {
        secfrac += '0';
    }
    assert(9 <= secfrac.size());
    const auto ms_r = from_string<int>(secfrac.substr(0, 3));
    const auto us_r = from_string<int>(secfrac.substr(3, 3));
    const auto ns_r = from_string<int>(secfrac.substr(6, 3));

    if(ms_r.is_err())
    {
        auto src = source_location(region(first));
        return err(make_error_info("toml::parse_local_time: "
            "failed to read milliseconds `" + secfrac.substr(0, 3) + "`",
            std::move(src), "here"));
    }
    if(us_r.is_err())
    {
        auto src = source_location(region(first));
        return err(make_error_info("toml::parse_local_time: "
            "failed to read microseconds`" + str.substr(3, 3) + "`",
            std::move(src), "here"));
    }
    if(ns_r.is_err())
    {
        auto src = source_location(region(first));
        return err(make_error_info("toml::parse_local_time: "
            "failed to read nanoseconds`" + str.substr(6, 3) + "`",
            std::move(src), "here"));
    }
    const auto ms = ms_r.unwrap();
    const auto us = us_r.unwrap();
    const auto ns = ns_r.unwrap();

    return ok(std::make_tuple(local_time(hour, minute, sec, ms, us, ns), std::move(fmt), std::move(reg)));
}